

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camellia.c
# Opt level: O3

int mbedtls_camellia_setkey_dec(mbedtls_camellia_context *ctx,uchar *key,uint keybits)

{
  ulong uVar1;
  undefined8 uVar2;
  uint32_t *puVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  uint32_t *puVar7;
  mbedtls_camellia_context cty;
  mbedtls_camellia_context local_134;
  
  memset(&local_134,0,0x114);
  iVar4 = mbedtls_camellia_setkey_enc(&local_134,key,keybits);
  if (iVar4 == 0) {
    ctx->nr = local_134.nr;
    uVar5 = (ulong)((uint)(local_134.nr == 4) * 8);
    uVar1 = (ulong)(local_134.nr == 4);
    uVar2 = *(undefined8 *)(local_134.rk + uVar1 * 0x10 + 0x32);
    *(undefined8 *)ctx->rk = *(undefined8 *)(local_134.rk + uVar1 * 0x10 + 0x30);
    *(undefined8 *)(ctx->rk + 2) = uVar2;
    puVar3 = ctx->rk + 4;
    do {
      puVar7 = puVar3;
      *(undefined8 *)puVar7 = *(undefined8 *)(local_134.rk + uVar5 * 2 + 0x2e);
      uVar5 = uVar5 - 1;
      puVar3 = puVar7 + 2;
    } while (uVar5 != 0xffffffffffffffea);
    *(undefined8 *)(puVar7 + 2) = local_134.rk._0_8_;
    *(undefined8 *)(puVar7 + 4) = local_134.rk._8_8_;
  }
  lVar6 = 0;
  do {
    *(undefined1 *)((long)local_134.rk + lVar6 + -4) = 0;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x114);
  return iVar4;
}

Assistant:

int mbedtls_camellia_setkey_dec( mbedtls_camellia_context *ctx, const unsigned char *key,
                         unsigned int keybits )
{
    int idx, ret;
    size_t i;
    mbedtls_camellia_context cty;
    uint32_t *RK;
    uint32_t *SK;

    mbedtls_camellia_init( &cty );

    /* Also checks keybits */
    if( ( ret = mbedtls_camellia_setkey_enc( &cty, key, keybits ) ) != 0 )
        goto exit;

    ctx->nr = cty.nr;
    idx = ( ctx->nr == 4 );

    RK = ctx->rk;
    SK = cty.rk + 24 * 2 + 8 * idx * 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

    for( i = 22 + 8 * idx, SK -= 6; i > 0; i--, SK -= 4 )
    {
        *RK++ = *SK++;
        *RK++ = *SK++;
    }

    SK -= 2;

    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;
    *RK++ = *SK++;

exit:
    mbedtls_camellia_free( &cty );

    return( ret );
}